

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cpp
# Opt level: O2

int __thiscall ncnn::Quantize::forward(Quantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  int iVar7;
  uint _c;
  int i;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  int local_a8;
  Mat local_78;
  
  iVar6 = bottom_blob->dims;
  if (iVar6 == 3) {
    iVar6 = bottom_blob->w;
    iVar1 = bottom_blob->h;
    uVar12 = bottom_blob->c;
    Mat::create(top_blob,iVar6,iVar1,uVar12,1,opt->blob_allocator);
    local_a8 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar11 = iVar1 * iVar6;
      if ((int)uVar11 < 1) {
        uVar11 = 0;
      }
      local_a8 = 0;
      if ((int)uVar12 < 1) {
        uVar12 = 0;
      }
      for (_c = 0; _c != uVar12; _c = _c + 1) {
        uVar10 = (ulong)_c;
        Mat::channel(&local_78,bottom_blob,_c);
        pvVar2 = local_78.data;
        Mat::~Mat(&local_78);
        Mat::channel(&local_78,top_blob,_c);
        pvVar3 = local_78.data;
        Mat::~Mat(&local_78);
        if (this->scale_data_size == 1) {
          uVar10 = 0;
        }
        fVar14 = *(float *)((long)(this->scale_data).data + uVar10 * 4);
        for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
          fVar13 = roundf(*(float *)((long)pvVar2 + uVar10 * 4) * fVar14);
          iVar6 = (int)fVar13;
          if (iVar6 < -0x7e) {
            iVar6 = -0x7f;
          }
          if (0x7e < iVar6) {
            iVar6 = 0x7f;
          }
          *(char *)((long)pvVar3 + uVar10) = (char)iVar6;
        }
      }
    }
  }
  else if (iVar6 == 2) {
    uVar12 = bottom_blob->w;
    uVar11 = bottom_blob->h;
    Mat::create(top_blob,uVar12,uVar11,1,opt->blob_allocator);
    local_a8 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if ((int)uVar12 < 1) {
        uVar12 = 0;
      }
      local_a8 = 0;
      uVar10 = (ulong)uVar11;
      if ((int)uVar11 < 1) {
        uVar10 = 0;
      }
      for (uVar9 = 0; uVar9 != uVar10; uVar9 = uVar9 + 1) {
        iVar6 = bottom_blob->w;
        iVar1 = top_blob->w;
        uVar8 = uVar9 & 0xffffffff;
        if (this->scale_data_size == 1) {
          uVar8 = 0;
        }
        fVar14 = *(float *)((long)(this->scale_data).data + uVar8 * 4);
        sVar4 = top_blob->elemsize;
        pvVar2 = top_blob->data;
        sVar5 = bottom_blob->elemsize;
        pvVar3 = bottom_blob->data;
        for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
          fVar13 = roundf(*(float *)((long)pvVar3 + uVar8 * 4 + sVar5 * uVar9 * (long)iVar6) *
                          fVar14);
          iVar7 = (int)fVar13;
          if (iVar7 < -0x7e) {
            iVar7 = -0x7f;
          }
          if (0x7e < iVar7) {
            iVar7 = 0x7f;
          }
          *(char *)((long)pvVar2 + uVar8 + sVar4 * uVar9 * (long)iVar1) = (char)iVar7;
        }
      }
    }
  }
  else {
    local_a8 = 0;
    if (iVar6 == 1) {
      uVar12 = bottom_blob->w;
      Mat::create(top_blob,uVar12,1,opt->blob_allocator);
      pvVar2 = top_blob->data;
      local_a8 = -100;
      if ((pvVar2 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        pvVar3 = bottom_blob->data;
        if (this->scale_data_size == 1) {
          local_a8 = 0;
          if ((int)uVar12 < 1) {
            uVar12 = 0;
          }
          fVar14 = *(this->scale_data).data;
          for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
            fVar13 = roundf(*(float *)((long)pvVar3 + uVar10 * 4) * fVar14);
            iVar6 = (int)fVar13;
            if (iVar6 < -0x7e) {
              iVar6 = -0x7f;
            }
            if (0x7e < iVar6) {
              iVar6 = 0x7f;
            }
            *(char *)((long)pvVar2 + uVar10) = (char)iVar6;
          }
        }
        else {
          local_a8 = 0;
          if ((int)uVar12 < 1) {
            uVar12 = 0;
          }
          for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
            fVar14 = roundf(*(float *)((long)(this->scale_data).data + uVar10 * 4) *
                            *(float *)((long)pvVar3 + uVar10 * 4));
            iVar6 = (int)fVar14;
            if (iVar6 < -0x7e) {
              iVar6 = -0x7f;
            }
            if (0x7e < iVar6) {
              iVar6 = 0x7f;
            }
            *(char *)((long)pvVar2 + uVar10) = (char)iVar6;
          }
        }
      }
    }
  }
  return local_a8;
}

Assistant:

int Quantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        int w = bottom_blob.w;

        top_blob.create(w, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const float* ptr = bottom_blob;
        signed char* outptr = top_blob;

        if (scale_data_size == 1)
        {
            const float scale = scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                outptr[i] = float2int8(ptr[i] * scale);
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                outptr[i] = float2int8(ptr[i] * scale_data[i]);
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        top_blob.create(w, h, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            const float* ptr0 = bottom_blob.row(i);
            signed char* outptr0 = top_blob.row<signed char>(i);

            const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[i];

            for (int j = 0; j < w; j++)
            {
                outptr0[j] = float2int8(ptr0[j] * scale);
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        top_blob.create(w, h, channels, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            signed char* outptr = top_blob.channel(q);

            const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[q];

            for (int i = 0; i < size; i++)
            {
                outptr[i] = float2int8(ptr[i] * scale);
            }
        }
    }

    return 0;
}